

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O3

Ssw_Cla_t * Ssw_ClassesPrepareTargets(Aig_Man_t *pAig)

{
  int iVar1;
  int iVar2;
  Ssw_Cla_t *pSVar3;
  Aig_Obj_t **ppAVar4;
  ulong uVar5;
  size_t __size;
  
  pSVar3 = Ssw_ClassesStart(pAig);
  pSVar3->nCands1 = 0;
  iVar1 = pAig->nTruePos;
  if ((long)iVar1 < 1) {
    __size = 0;
  }
  else {
    uVar5 = 0;
    do {
      if ((long)pAig->vCos->nSize <= (long)uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppAVar4 = pAig->pReprs;
      if (ppAVar4 == (Aig_Obj_t **)0x0) {
        if (pAig->pConst1 != (Aig_Obj_t *)0x0) {
          __assert_fail("p->pReprs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
        }
LAB_00912a6a:
        __assert_fail("!Ssw_ObjIsConst1Cand( pAig, pObj )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswInt.h"
                      ,0xb2,"void Ssw_ObjSetConst1Cand(Aig_Man_t *, Aig_Obj_t *)");
      }
      iVar2 = *(int *)((*(ulong *)((long)pAig->vCos->pArray[uVar5] + 8) & 0xfffffffffffffffe) + 0x24
                      );
      if (ppAVar4[iVar2] == pAig->pConst1) goto LAB_00912a6a;
      ppAVar4[iVar2] = pAig->pConst1;
      uVar5 = uVar5 + 1;
      pSVar3->nCands1 = (int)uVar5;
    } while (uVar5 != (long)iVar1);
    __size = (uVar5 & 0xffffffff) << 3;
  }
  ppAVar4 = (Aig_Obj_t **)malloc(__size);
  pSVar3->pMemClasses = ppAVar4;
  pSVar3->pMemClassesFree = ppAVar4;
  return pSVar3;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPrepareTargets( Aig_Man_t * pAig )
{
    Ssw_Cla_t * p;
    Aig_Obj_t * pObj;
    int i;
    // start the classes
    p = Ssw_ClassesStart( pAig );
    // go through the nodes
    p->nCands1 = 0;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        Ssw_ObjSetConst1Cand( pAig, Aig_ObjFanin0(pObj) );
        p->nCands1++;
    }
    // allocate room for classes
    p->pMemClassesFree = p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, p->nCands1 );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}